

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_A_Look2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  uint uVar3;
  undefined8 *puVar4;
  AActor *t2;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *t1;
  VMValue *pVVar9;
  FState *pFVar10;
  char *__assertion;
  bool bVar11;
  bool bVar12;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00523ab3;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00523aa3;
  t1 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_00523884;
    pPVar8 = (t1->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar6 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar6);
      (t1->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar11 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar8 == pPVar5;
    if (!bVar12 && !bVar11) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar5) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar7 = (uint)bVar11;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00523ab3;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_00523aa3;
LAB_00523884:
    t1 = (AActor *)0x0;
    pVVar9 = param;
    uVar7 = numparam;
  }
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_00523aa3:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00523ab3;
      }
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar4 != (undefined8 *)0x0) {
          pPVar8 = (PClass *)puVar4[1];
          if (pPVar8 == (PClass *)0x0) {
            pPVar8 = (PClass *)(**(code **)*puVar4)(puVar4,pVVar9,uVar7,ret);
            puVar4[1] = pPVar8;
          }
          bVar11 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar5 && bVar11) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar11 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar5) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (!bVar11) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_00523ab3;
          }
        }
      }
      else if (puVar4 != (undefined8 *)0x0) goto LAB_00523aa3;
    }
    if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00523ab3:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                    ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (((t1->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  t1->threshold = 0;
  t2 = (t1->LastHeard).field_0.p;
  if (t2 != (AActor *)0x0) {
    if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((0 < t2->health) && (uVar7 = (t2->flags).Value, (uVar7 & 4) != 0)) {
        uVar3 = (t1->flags).Value;
        if (((level.flags._3_1_ & 0x20) == 0) && (((uVar7 ^ uVar3) >> 0x1b & 1) == 0)) {
          bVar11 = P_LookForPlayers(t1,(t1->flags4).Value & 0x10000,(FLookExParams *)0x0);
          if (bVar11) {
            AActor::SetState(t1,t1->SeeState,false);
            pbVar1 = (byte *)((long)&(t1->flags4).Value + 1);
            *pbVar1 = *pbVar1 | 0x80;
            return 0;
          }
        }
        else if (((uVar3 & 0x20) == 0) || (bVar11 = P_CheckSight(t1,t2,4), bVar11)) {
          (t1->target).field_0.p = t2;
          t1->threshold = 10;
          pFVar10 = t1->SeeState;
          goto LAB_00523a57;
        }
      }
    }
    else {
      (t1->LastHeard).field_0.p = (AActor *)0x0;
    }
  }
  uVar7 = FRandom::GenRand32(&pr_look2);
  if ((uVar7 & 0xfe) < 0x1e) {
    pFVar10 = t1->SpawnState;
    uVar7 = FRandom::GenRand32(&pr_look2);
    AActor::SetState(t1,pFVar10 + (ulong)(uVar7 & 1) + 1,false);
  }
  if (((t1->flags4).Value & 0x20000) != 0) {
    return 0;
  }
  uVar7 = FRandom::GenRand32(&pr_look2);
  if (0x27 < (uVar7 & 0xf8)) {
    return 0;
  }
  pFVar10 = t1->SpawnState + 3;
LAB_00523a57:
  AActor::SetState(t1,pFVar10,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}